

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

void rw::memNative32_func(void *data,uint32 size)

{
  uint32 *local_28;
  uint32 *words;
  uint8 *bytes;
  uint32 size_local;
  void *data_local;
  
  local_28 = (uint32 *)data;
  words = (uint32 *)data;
  bytes._4_4_ = size >> 2;
  while (bytes._4_4_ != 0) {
    *local_28 = *words;
    words = words + 1;
    local_28 = local_28 + 1;
    bytes._4_4_ = bytes._4_4_ - 1;
  }
  return;
}

Assistant:

void
memNative32_func(void *data, uint32 size)
{
	uint8 *bytes = (uint8*)data;
	uint32 *words = (uint32*)data;
	size >>= 2;
	while(size--){
		*words++ = (uint32)bytes[0] | (uint32)bytes[1]<<8 |
			(uint32)bytes[2]<<16 | (uint32)bytes[3]<<24;
		bytes += 4;
	}
}